

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void GetWin32EscapedString(string *input,string *result)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  const_iterator it;
  char *pcVar6;
  size_type sVar7;
  char cVar8;
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/util.cc"
                  ,0x11c,"void GetWin32EscapedString(const string &, string *)");
  }
  pbVar1 = (byte *)(input->_M_dataplus)._M_p;
  uVar2 = input->_M_string_length;
  if (uVar2 == 0) {
LAB_0011bdfb:
    std::__cxx11::string::_M_append((char *)result,(ulong)pbVar1);
    return;
  }
  if ((*pbVar1 & 0xfd) != 0x20) {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (uVar2 == uVar4) break;
      uVar3 = uVar4 + 1;
    } while ((pbVar1[uVar4] & 0xfd) != 0x20);
    if (uVar2 <= uVar4) goto LAB_0011bdfb;
  }
  std::__cxx11::string::push_back((char)result);
  pcVar5 = (input->_M_dataplus)._M_p;
  sVar7 = input->_M_string_length;
  if (sVar7 == 0) {
    cVar8 = '\0';
  }
  else {
    cVar8 = '\0';
    pcVar6 = pcVar5;
    do {
      if (*pcVar6 == '\"') {
        std::__cxx11::string::replace
                  ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar5);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)result,result->_M_string_length,0,cVar8 + '\x01');
        pcVar5 = pcVar6;
LAB_0011bde4:
        cVar8 = '\0';
      }
      else {
        if (*pcVar6 != '\\') goto LAB_0011bde4;
        cVar8 = cVar8 + '\x01';
      }
      pcVar6 = pcVar6 + 1;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  std::__cxx11::string::replace((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar5);
  std::__cxx11::string::_M_replace_aux((ulong)result,result->_M_string_length,0,cVar8);
  std::__cxx11::string::push_back((char)result);
  return;
}

Assistant:

void GetWin32EscapedString(const string& input, string* result) {
  assert(result);
  if (!StringNeedsWin32Escaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '"';
  const char kBackslash = '\\';

  result->push_back(kQuote);
  size_t consecutive_backslash_count = 0;
  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    switch (*it) {
      case kBackslash:
        ++consecutive_backslash_count;
        break;
      case kQuote:
        result->append(span_begin, it);
        result->append(consecutive_backslash_count + 1, kBackslash);
        span_begin = it;
        consecutive_backslash_count = 0;
        break;
      default:
        consecutive_backslash_count = 0;
        break;
    }
  }
  result->append(span_begin, input.end());
  result->append(consecutive_backslash_count, kBackslash);
  result->push_back(kQuote);
}